

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O2

UniquePtr<SSL_SESSION> bssl::tls13_create_session_with_ticket(SSL *ssl,CBS *body)

{
  UniquePtr<SSL_SESSION> this;
  bool bVar1;
  int iVar2;
  CBS *in_RDX;
  undefined1 in_R8B;
  undefined1 in_R9B;
  initializer_list<bssl::SSLExtension_*> extensions_00;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> nonce;
  uint8_t alert;
  UniquePtr<SSL_SESSION> session;
  uint32_t server_timeout;
  CBS ticket;
  SSLFlags parsed;
  SSLExtension *local_80;
  CBS ticket_nonce;
  SSLExtension early_data;
  SSLExtension flags;
  CBS extensions;
  
  SSL_SESSION_dup((bssl *)&session,*(SSL_SESSION **)(body[3].data + 0x200),2);
  if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) goto LAB_0016163e;
  ssl_session_rebase_time
            ((SSL *)body,
             (SSL_SESSION *)
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
  iVar2 = CBS_get_u32(in_RDX,&server_timeout);
  if (iVar2 == 0) {
LAB_00161614:
    ssl_send_alert((SSL *)body,2,0x32);
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x498);
  }
  else {
    iVar2 = CBS_get_u32(in_RDX,(uint32_t *)
                               ((long)session._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                               0x180));
    if (iVar2 == 0) goto LAB_00161614;
    iVar2 = CBS_get_u8_length_prefixed(in_RDX,&ticket_nonce);
    if (iVar2 == 0) goto LAB_00161614;
    iVar2 = CBS_get_u16_length_prefixed(in_RDX,&ticket);
    if ((iVar2 == 0) || (ticket.len == 0)) goto LAB_00161614;
    in.size_ = ticket.len;
    in.data_ = ticket.data;
    bVar1 = Array<unsigned_char>::CopyFrom
                      ((Array<unsigned_char> *)
                       ((long)session._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xf8),in
                      );
    if (!bVar1) goto LAB_00161614;
    iVar2 = CBS_get_u16_length_prefixed(in_RDX,&extensions);
    this = session;
    if ((iVar2 == 0) || (in_RDX->len != 0)) goto LAB_00161614;
    if (server_timeout <
        *(uint *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 200)) {
      *(uint32_t *)
       ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 200) = server_timeout;
    }
    iVar2 = SSL_is_dtls((SSL *)body);
    nonce.size_._0_1_ = iVar2 != 0;
    nonce.data_ = (uchar *)ticket_nonce.len;
    nonce.size_._1_7_ = 0;
    bVar1 = tls13_derive_session_psk
                      ((bssl *)this._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                       (SSL_SESSION *)ticket_nonce.data,nonce,(bool)in_R8B);
    if (bVar1) {
      _parsed = &early_data;
      early_data.type = 0x2a;
      early_data.allowed = true;
      early_data.present = false;
      early_data.data.data = (uint8_t *)0x0;
      early_data.data.len = 0;
      local_80 = &flags;
      flags.type = 0x3e;
      flags.allowed = true;
      flags.present = false;
      flags.data.data = (uint8_t *)0x0;
      flags.data.len = 0;
      alert = '2';
      extensions_00._M_len = 1;
      extensions_00._M_array = (iterator)0x2;
      bVar1 = ssl_parse_extensions
                        ((bssl *)&extensions,(CBS *)&alert,(uint8_t *)&parsed,extensions_00,
                         (bool)in_R9B);
      if (bVar1) {
        if (early_data.present != true) {
LAB_00161782:
          if (flags.present == true) {
            bVar1 = ssl_parse_flags_extension_request(&flags.data,&parsed,&alert);
            if (!bVar1) {
              ssl_send_alert((SSL *)body,2,(uint)alert);
              goto LAB_0016163e;
            }
            if (((ulong)_parsed & 0x100) != 0) {
              *(byte *)((long)session._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
                   *(byte *)((long)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            0x1b8) | 0x80;
            }
          }
          InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite
                    ((InplaceVector<unsigned_char,_32UL> *)
                     ((long)session._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x4b),0x20
                    );
          SHA256(ticket.data,ticket.len,
                 (uchar *)((long)session._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x4b)
                );
          *(byte *)((long)session._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
               *(byte *)((long)session._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8)
               & 0xf3 | 8;
          ssl->method = (SSL_PROTOCOL_METHOD *)
                        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          goto LAB_00161642;
        }
        iVar2 = CBS_get_u32(&early_data.data,
                            (uint32_t *)
                            ((long)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            0x184));
        if ((iVar2 == 0) || (early_data.data.len != 0)) {
          ssl_send_alert((SSL *)body,2,0x32);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x4b4);
        }
        else {
          iVar2 = SSL_is_quic((SSL *)body);
          if ((iVar2 == 0) ||
             (*(int *)((long)session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x184) ==
              -1)) goto LAB_00161782;
          ssl_send_alert((SSL *)body,2,0x2f);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x4bc);
        }
      }
      else {
        ssl_send_alert((SSL *)body,2,(uint)alert);
      }
    }
  }
LAB_0016163e:
  ssl->method = (SSL_PROTOCOL_METHOD *)0x0;
LAB_00161642:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)ssl;
}

Assistant:

UniquePtr<SSL_SESSION> tls13_create_session_with_ticket(SSL *ssl, CBS *body) {
  UniquePtr<SSL_SESSION> session = SSL_SESSION_dup(
      ssl->s3->established_session.get(), SSL_SESSION_INCLUDE_NONAUTH);
  if (!session) {
    return nullptr;
  }

  ssl_session_rebase_time(ssl, session.get());

  uint32_t server_timeout;
  CBS ticket_nonce, ticket, extensions;
  if (!CBS_get_u32(body, &server_timeout) ||
      !CBS_get_u32(body, &session->ticket_age_add) ||
      !CBS_get_u8_length_prefixed(body, &ticket_nonce) ||
      !CBS_get_u16_length_prefixed(body, &ticket) ||
      CBS_len(&ticket) == 0 ||  //
      !session->ticket.CopyFrom(ticket) ||
      !CBS_get_u16_length_prefixed(body, &extensions) ||  //
      CBS_len(body) != 0) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  // Cap the renewable lifetime by the server advertised value. This avoids
  // wasting bandwidth on 0-RTT when we know the server will reject it.
  if (session->timeout > server_timeout) {
    session->timeout = server_timeout;
  }

  if (!tls13_derive_session_psk(session.get(), ticket_nonce,
                                SSL_is_dtls(ssl))) {
    return nullptr;
  }

  SSLExtension early_data(TLSEXT_TYPE_early_data);
  SSLExtension flags(TLSEXT_TYPE_tls_flags);
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_parse_extensions(&extensions, &alert, {&early_data, &flags},
                            /*ignore_unknown=*/true)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return nullptr;
  }

  if (early_data.present) {
    if (!CBS_get_u32(&early_data.data, &session->ticket_max_early_data) ||
        CBS_len(&early_data.data) != 0) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }

    // QUIC does not use the max_early_data_size parameter and always sets it to
    // a fixed value. See RFC 9001, section 4.6.1.
    if (SSL_is_quic(ssl) && session->ticket_max_early_data != 0xffffffff) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (flags.present) {
    SSLFlags parsed;
    if (!ssl_parse_flags_extension_request(&flags.data, &parsed, &alert)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return nullptr;
    }
    if (parsed & kSSLFlagResumptionAcrossNames) {
      session->is_resumable_across_names = true;
    }
  }

  // Historically, OpenSSL filled in fake session IDs for ticket-based sessions.
  // Envoy's tests depend on this, although perhaps they shouldn't.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(CBS_data(&ticket), CBS_len(&ticket), session->session_id.data());

  session->ticket_age_add_valid = true;
  session->not_resumable = false;

  return session;
}